

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::BNTest_ASN1_Test>::CreateTest
          (TestFactoryImpl<(anonymous_namespace)::BNTest_ASN1_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<(anonymous_namespace)::BNTest_ASN1_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x18);
  anon_unknown.dwarf_22460c::BNTest_ASN1_Test::BNTest_ASN1_Test((BNTest_ASN1_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }